

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O3

void Edg_ManToMapping(Gia_Man_t *p)

{
  uint Entry;
  void *pvVar1;
  int *piVar2;
  uint uVar3;
  Vec_Wec_t *pVVar4;
  Vec_Int_t *pVVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  
  if (p->vMapping == (Vec_Int_t *)0x0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                  ,0x294,"void Edg_ManToMapping(Gia_Man_t *)");
  }
  pVVar4 = p->vMapping2;
  if (pVVar4 != (Vec_Wec_t *)0x0) {
    iVar6 = pVVar4->nCap;
    pVVar5 = pVVar4->pArray;
    if (iVar6 < 1) {
      if (pVVar5 != (Vec_Int_t *)0x0) goto LAB_001fa89e;
    }
    else {
      lVar9 = 8;
      lVar13 = 0;
      do {
        pvVar1 = *(void **)((long)&pVVar5->nCap + lVar9);
        if (pvVar1 != (void *)0x0) {
          free(pvVar1);
          pVVar5 = pVVar4->pArray;
          *(undefined8 *)((long)&pVVar5->nCap + lVar9) = 0;
          iVar6 = pVVar4->nCap;
        }
        lVar13 = lVar13 + 1;
        lVar9 = lVar9 + 0x10;
      } while (lVar13 < iVar6);
LAB_001fa89e:
      free(pVVar5);
    }
    free(pVVar4);
    p->vMapping2 = (Vec_Wec_t *)0x0;
  }
  pVVar4 = p->vFanouts2;
  if (pVVar4 == (Vec_Wec_t *)0x0) goto LAB_001fa92b;
  iVar6 = pVVar4->nCap;
  pVVar5 = pVVar4->pArray;
  if (iVar6 < 1) {
    if (pVVar5 != (Vec_Int_t *)0x0) goto LAB_001fa90f;
  }
  else {
    lVar9 = 8;
    lVar13 = 0;
    do {
      pvVar1 = *(void **)((long)&pVVar5->nCap + lVar9);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
        pVVar5 = pVVar4->pArray;
        *(undefined8 *)((long)&pVVar5->nCap + lVar9) = 0;
        iVar6 = pVVar4->nCap;
      }
      lVar13 = lVar13 + 1;
      lVar9 = lVar9 + 0x10;
    } while (lVar13 < iVar6);
LAB_001fa90f:
    free(pVVar5);
  }
  free(pVVar4);
  p->vFanouts2 = (Vec_Wec_t *)0x0;
LAB_001fa92b:
  iVar6 = p->nObjs;
  pVVar4 = (Vec_Wec_t *)malloc(0x10);
  iVar7 = 8;
  if (6 < iVar6 - 1U) {
    iVar7 = iVar6;
  }
  pVVar4->nCap = iVar7;
  if (iVar7 == 0) {
    pVVar5 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar5 = (Vec_Int_t *)calloc((long)iVar7,0x10);
  }
  pVVar4->pArray = pVVar5;
  pVVar4->nSize = iVar6;
  p->vMapping2 = pVVar4;
  pVVar4 = (Vec_Wec_t *)malloc(0x10);
  pVVar4->nCap = iVar7;
  if (iVar7 == 0) {
    pVVar5 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar5 = (Vec_Int_t *)calloc((long)iVar7,0x10);
  }
  pVVar4->pArray = pVVar5;
  pVVar4->nSize = iVar6;
  p->vFanouts2 = pVVar4;
  if (1 < iVar6) {
    pVVar5 = p->vMapping;
    lVar9 = 1;
    do {
      if (pVVar5->nSize <= lVar9) goto LAB_001fabbd;
      uVar3 = pVVar5->pArray[lVar9];
      if ((ulong)uVar3 != 0) {
        if (((int)uVar3 < 0) || ((uint)pVVar5->nSize <= uVar3)) {
LAB_001fabbd:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (4 < pVVar5->pArray[uVar3]) {
          __assert_fail("Gia_ObjLutSize(p, iObj) <= 4",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                        ,0x29b,"void Edg_ManToMapping(Gia_Man_t *)");
        }
        lVar13 = (long)pVVar5->nSize;
        if (lVar13 <= lVar9) goto LAB_001fabbd;
        uVar3 = (int)lVar9 + 1;
        lVar12 = 0;
        while( true ) {
          piVar2 = pVVar5->pArray;
          lVar10 = (long)piVar2[lVar9];
          if ((lVar10 < 0) || ((uint)lVar13 <= (uint)piVar2[lVar9])) goto LAB_001fabbd;
          if (piVar2[lVar10] <= lVar12) break;
          Entry = piVar2[lVar10 + lVar12 + 1];
          pVVar4 = p->vMapping2;
          if (pVVar4->nSize <= lVar9) {
            uVar8 = pVVar4->nSize * 2;
            if ((int)uVar8 <= (int)uVar3) {
              uVar8 = uVar3;
            }
            iVar6 = pVVar4->nCap;
            if (iVar6 < (int)uVar8) {
              if (pVVar4->pArray == (Vec_Int_t *)0x0) {
                pVVar5 = (Vec_Int_t *)malloc((ulong)uVar8 << 4);
              }
              else {
                pVVar5 = (Vec_Int_t *)realloc(pVVar4->pArray,(ulong)uVar8 << 4);
                iVar6 = pVVar4->nCap;
              }
              pVVar4->pArray = pVVar5;
              memset(pVVar5 + iVar6,0,(long)(int)(uVar8 - iVar6) << 4);
              pVVar4->nCap = uVar8;
            }
            pVVar4->nSize = uVar3;
          }
          Vec_IntPush(pVVar4->pArray + lVar9,Entry);
          pVVar4 = p->vFanouts2;
          iVar6 = pVVar4->nSize;
          if (iVar6 <= (int)Entry) {
            iVar11 = Entry + 1;
            iVar7 = iVar6 * 2;
            if (iVar6 * 2 <= iVar11) {
              iVar7 = iVar11;
            }
            iVar6 = pVVar4->nCap;
            if (iVar6 < iVar7) {
              if (pVVar4->pArray == (Vec_Int_t *)0x0) {
                pVVar5 = (Vec_Int_t *)malloc((long)iVar7 << 4);
              }
              else {
                pVVar5 = (Vec_Int_t *)realloc(pVVar4->pArray,(long)iVar7 << 4);
                iVar6 = pVVar4->nCap;
              }
              pVVar4->pArray = pVVar5;
              memset(pVVar5 + iVar6,0,(long)(iVar7 - iVar6) << 4);
              pVVar4->nCap = iVar7;
            }
            pVVar4->nSize = iVar11;
            iVar6 = iVar11;
          }
          if (((int)Entry < 0) || (iVar6 <= (int)Entry)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                          ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          Vec_IntPush(pVVar4->pArray + Entry,(int)lVar9);
          lVar12 = lVar12 + 1;
          pVVar5 = p->vMapping;
          lVar13 = (long)pVVar5->nSize;
          if (lVar13 <= lVar9) goto LAB_001fabbd;
        }
        iVar6 = p->nObjs;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar6);
  }
  return;
}

Assistant:

void Edg_ManToMapping( Gia_Man_t * p )
{
    int iObj, iFanin, k;
    assert( Gia_ManHasMapping(p) );
    Vec_WecFreeP( &p->vMapping2 );
    Vec_WecFreeP( &p->vFanouts2 );
    p->vMapping2 = Vec_WecStart( Gia_ManObjNum(p) );
    p->vFanouts2 = Vec_WecStart( Gia_ManObjNum(p) );
    Gia_ManForEachLut( p, iObj )
    {
        assert( Gia_ObjLutSize(p, iObj) <= 4 );
        Gia_LutForEachFanin( p, iObj, iFanin, k )
        {
            Vec_WecPush( p->vMapping2, iObj, iFanin );
            Vec_WecPush( p->vFanouts2, iFanin, iObj );
        }
    }
}